

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSerialize.cpp
# Opt level: O1

void TTD::NSTokens::InitKeyNamesArray(char16 ***names,size_t **lengths)

{
  HeapAllocator *pHVar1;
  char16 **ppcVar2;
  size_t *psVar3;
  size_t sVar4;
  undefined1 local_50 [8];
  TrackAllocData data;
  
  local_50 = (undefined1  [8])&char16_t_const*::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0x78;
  data.count = (size_t)anon_var_dwarf_4217728;
  data.filename._0_4_ = 0xf;
  pHVar1 = Memory::HeapAllocator::TrackAllocInfo
                     (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_50);
  ppcVar2 = (char16 **)Memory::HeapAllocator::AllocT<true>(pHVar1,0x3c0);
  if (ppcVar2 != (char16 **)0x0) {
    local_50 = (undefined1  [8])&unsigned_long::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0x78;
    data.count = (size_t)anon_var_dwarf_4217728;
    data.filename._0_4_ = 0x10;
    pHVar1 = Memory::HeapAllocator::TrackAllocInfo
                       (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_50);
    psVar3 = (size_t *)Memory::HeapAllocator::AllocT<true>(pHVar1,0x3c0);
    if (psVar3 != (size_t *)0x0) {
      ppcVar2[1] = L"count";
      sVar4 = PAL_wcslen(L"count");
      psVar3[1] = sVar4;
      ppcVar2[2] = L"values";
      sVar4 = PAL_wcslen(L"values");
      psVar3[2] = sVar4;
      ppcVar2[3] = L"entry";
      sVar4 = PAL_wcslen(L"entry");
      psVar3[3] = sVar4;
      ppcVar2[4] = L"index";
      sVar4 = PAL_wcslen(L"index");
      psVar3[4] = sVar4;
      ppcVar2[5] = L"offset";
      sVar4 = PAL_wcslen(L"offset");
      psVar3[5] = sVar4;
      ppcVar2[6] = L"resultValue";
      sVar4 = PAL_wcslen(L"resultValue");
      psVar3[6] = sVar4;
      ppcVar2[7] = L"reaction";
      sVar4 = PAL_wcslen(L"reaction");
      psVar3[7] = sVar4;
      ppcVar2[8] = L"pid";
      sVar4 = PAL_wcslen(L"pid");
      psVar3[8] = sVar4;
      ppcVar2[9] = L"nullVal";
      sVar4 = PAL_wcslen(L"nullVal");
      psVar3[9] = sVar4;
      ppcVar2[10] = L"boolVal";
      sVar4 = PAL_wcslen(L"boolVal");
      psVar3[10] = sVar4;
      ppcVar2[0xb] = L"i32Val";
      sVar4 = PAL_wcslen(L"i32Val");
      psVar3[0xb] = sVar4;
      ppcVar2[0xc] = L"u32Val";
      sVar4 = PAL_wcslen(L"u32Val");
      psVar3[0xc] = sVar4;
      ppcVar2[0xd] = L"i64Val";
      sVar4 = PAL_wcslen(L"i64Val");
      psVar3[0xd] = sVar4;
      ppcVar2[0xe] = L"u64Val";
      sVar4 = PAL_wcslen(L"u64Val");
      psVar3[0xe] = sVar4;
      ppcVar2[0xf] = L"doubleVal";
      sVar4 = PAL_wcslen(L"doubleVal");
      psVar3[0xf] = sVar4;
      ppcVar2[0x10] = L"ptrIdVal";
      sVar4 = PAL_wcslen(L"ptrIdVal");
      psVar3[0x10] = sVar4;
      ppcVar2[0x11] = L"stringVal";
      sVar4 = PAL_wcslen(L"stringVal");
      psVar3[0x11] = sVar4;
      ppcVar2[0x12] = L"argRetVal";
      sVar4 = PAL_wcslen(L"argRetVal");
      psVar3[0x12] = sVar4;
      ppcVar2[0x13] = L"newTargetVal";
      sVar4 = PAL_wcslen(L"newTargetVal");
      psVar3[0x13] = sVar4;
      ppcVar2[0x14] = L"ttdVarTag";
      sVar4 = PAL_wcslen(L"ttdVarTag");
      psVar3[0x14] = sVar4;
      ppcVar2[0x15] = L"getterEntry";
      sVar4 = PAL_wcslen(L"getterEntry");
      psVar3[0x15] = sVar4;
      ppcVar2[0x16] = L"setterEntry";
      sVar4 = PAL_wcslen(L"setterEntry");
      psVar3[0x16] = sVar4;
      ppcVar2[0x17] = L"tagVal";
      sVar4 = PAL_wcslen(L"tagVal");
      psVar3[0x17] = sVar4;
      ppcVar2[0x18] = L"originInfo";
      sVar4 = PAL_wcslen(L"originInfo");
      psVar3[0x18] = sVar4;
      ppcVar2[0x19] = L"isWellKnownToken";
      sVar4 = PAL_wcslen(L"isWellKnownToken");
      psVar3[0x19] = sVar4;
      ppcVar2[0x1a] = L"wellKnownToken";
      sVar4 = PAL_wcslen(L"wellKnownToken");
      psVar3[0x1a] = sVar4;
      ppcVar2[0x1b] = L"isCrossSite";
      sVar4 = PAL_wcslen(L"isCrossSite");
      psVar3[0x1b] = sVar4;
      ppcVar2[0x1c] = L"dataKindTag";
      sVar4 = PAL_wcslen(L"dataKindTag");
      psVar3[0x1c] = sVar4;
      ppcVar2[0x1d] = L"attributeTag";
      sVar4 = PAL_wcslen(L"attributeTag");
      psVar3[0x1d] = sVar4;
      ppcVar2[0x1e] = L"propertyId";
      sVar4 = PAL_wcslen(L"propertyId");
      psVar3[0x1e] = sVar4;
      ppcVar2[0x1f] = L"handlerType";
      sVar4 = PAL_wcslen(L"handlerType");
      psVar3[0x1f] = sVar4;
      ppcVar2[0x20] = L"jsTypeId";
      sVar4 = PAL_wcslen(L"jsTypeId");
      psVar3[0x20] = sVar4;
      ppcVar2[0x21] = L"scopeType";
      sVar4 = PAL_wcslen(L"scopeType");
      psVar3[0x21] = sVar4;
      ppcVar2[0x22] = L"objectType";
      sVar4 = PAL_wcslen(L"objectType");
      psVar3[0x22] = sVar4;
      ppcVar2[0x23] = L"argRetValueType";
      sVar4 = PAL_wcslen(L"argRetValueType");
      psVar3[0x23] = sVar4;
      ppcVar2[0x24] = L"ctxTag";
      sVar4 = PAL_wcslen(L"ctxTag");
      psVar3[0x24] = sVar4;
      ppcVar2[0x25] = L"ctxUri";
      sVar4 = PAL_wcslen(L"ctxUri");
      psVar3[0x25] = sVar4;
      ppcVar2[0x26] = L"logTag";
      sVar4 = PAL_wcslen(L"logTag");
      psVar3[0x26] = sVar4;
      ppcVar2[0x27] = L"handlerId";
      sVar4 = PAL_wcslen(L"handlerId");
      psVar3[0x27] = sVar4;
      ppcVar2[0x28] = L"typeId";
      sVar4 = PAL_wcslen(L"typeId");
      psVar3[0x28] = sVar4;
      ppcVar2[0x29] = L"prototypeVar";
      sVar4 = PAL_wcslen(L"prototypeVar");
      psVar3[0x29] = sVar4;
      ppcVar2[0x2a] = L"functionBodyId";
      sVar4 = PAL_wcslen(L"functionBodyId");
      psVar3[0x2a] = sVar4;
      ppcVar2[0x2b] = L"debuggerScopeId";
      sVar4 = PAL_wcslen(L"debuggerScopeId");
      psVar3[0x2b] = sVar4;
      ppcVar2[0x2c] = L"parentBodyId";
      sVar4 = PAL_wcslen(L"parentBodyId");
      psVar3[0x2c] = sVar4;
      ppcVar2[0x2d] = L"bodyCounterId";
      sVar4 = PAL_wcslen(L"bodyCounterId");
      psVar3[0x2d] = sVar4;
      ppcVar2[0x2e] = L"cachedScopeObjId";
      sVar4 = PAL_wcslen(L"cachedScopeObjId");
      psVar3[0x2e] = sVar4;
      ppcVar2[0x2f] = L"scopeId";
      sVar4 = PAL_wcslen(L"scopeId");
      psVar3[0x2f] = sVar4;
      ppcVar2[0x30] = L"subscopeId";
      sVar4 = PAL_wcslen(L"subscopeId");
      psVar3[0x30] = sVar4;
      ppcVar2[0x31] = L"slotId";
      sVar4 = PAL_wcslen(L"slotId");
      psVar3[0x31] = sVar4;
      ppcVar2[0x32] = L"primitiveId";
      sVar4 = PAL_wcslen(L"primitiveId");
      psVar3[0x32] = sVar4;
      ppcVar2[0x33] = L"objectId";
      sVar4 = PAL_wcslen(L"objectId");
      psVar3[0x33] = sVar4;
      ppcVar2[0x34] = L"attributeFlags";
      sVar4 = PAL_wcslen(L"attributeFlags");
      psVar3[0x34] = sVar4;
      ppcVar2[0x35] = L"extensibleFlag";
      sVar4 = PAL_wcslen(L"extensibleFlag");
      psVar3[0x35] = sVar4;
      ppcVar2[0x36] = L"fcallFlags";
      sVar4 = PAL_wcslen(L"fcallFlags");
      psVar3[0x36] = sVar4;
      ppcVar2[0x37] = L"name";
      sVar4 = PAL_wcslen(L"name");
      psVar3[0x37] = sVar4;
      ppcVar2[0x38] = L"nameInfo";
      sVar4 = PAL_wcslen(L"nameInfo");
      psVar3[0x38] = sVar4;
      ppcVar2[0x39] = L"srcLocation";
      sVar4 = PAL_wcslen(L"srcLocation");
      psVar3[0x39] = sVar4;
      ppcVar2[0x3a] = L"src";
      sVar4 = PAL_wcslen(L"src");
      psVar3[0x3a] = sVar4;
      ppcVar2[0x3b] = L"column";
      sVar4 = PAL_wcslen(L"column");
      psVar3[0x3b] = sVar4;
      ppcVar2[0x3c] = L"line";
      sVar4 = PAL_wcslen(L"line");
      psVar3[0x3c] = sVar4;
      ppcVar2[0x3d] = L"functionColumn";
      sVar4 = PAL_wcslen(L"functionColumn");
      psVar3[0x3d] = sVar4;
      ppcVar2[0x3e] = L"functionLine";
      sVar4 = PAL_wcslen(L"functionLine");
      psVar3[0x3e] = sVar4;
      ppcVar2[0x3f] = L"uri";
      sVar4 = PAL_wcslen(L"uri");
      psVar3[0x3f] = sVar4;
      ppcVar2[0x40] = L"moduleId";
      sVar4 = PAL_wcslen(L"moduleId");
      psVar3[0x40] = sVar4;
      ppcVar2[0x41] = L"sourceContextId";
      sVar4 = PAL_wcslen(L"sourceContextId");
      psVar3[0x41] = sVar4;
      ppcVar2[0x42] = L"isGlobalCode";
      sVar4 = PAL_wcslen(L"isGlobalCode");
      psVar3[0x42] = sVar4;
      ppcVar2[0x43] = L"scopeChain";
      sVar4 = PAL_wcslen(L"scopeChain");
      psVar3[0x43] = sVar4;
      ppcVar2[0x44] = L"boundFunction";
      sVar4 = PAL_wcslen(L"boundFunction");
      psVar3[0x44] = sVar4;
      ppcVar2[0x45] = L"boundThis";
      sVar4 = PAL_wcslen(L"boundThis");
      psVar3[0x45] = sVar4;
      ppcVar2[0x46] = L"boundArgs";
      sVar4 = PAL_wcslen(L"boundArgs");
      psVar3[0x46] = sVar4;
      ppcVar2[0x47] = L"numberOfArgs";
      sVar4 = PAL_wcslen(L"numberOfArgs");
      psVar3[0x47] = sVar4;
      ppcVar2[0x48] = L"deletedArgs";
      sVar4 = PAL_wcslen(L"deletedArgs");
      psVar3[0x48] = sVar4;
      ppcVar2[0x49] = L"boxedInfo";
      sVar4 = PAL_wcslen(L"boxedInfo");
      psVar3[0x49] = sVar4;
      ppcVar2[0x4a] = L"inlineSlotCapacity";
      sVar4 = PAL_wcslen(L"inlineSlotCapacity");
      psVar3[0x4a] = sVar4;
      ppcVar2[0x4b] = L"totalSlotCapacity";
      sVar4 = PAL_wcslen(L"totalSlotCapacity");
      psVar3[0x4b] = sVar4;
      ppcVar2[0x4c] = L"isFunctionMetaData";
      sVar4 = PAL_wcslen(L"isFunctionMetaData");
      psVar3[0x4c] = sVar4;
      ppcVar2[0x4d] = L"isDepOn";
      sVar4 = PAL_wcslen(L"isDepOn");
      psVar3[0x4d] = sVar4;
      ppcVar2[0x4e] = L"isExpression";
      sVar4 = PAL_wcslen(L"isExpression");
      psVar3[0x4e] = sVar4;
      ppcVar2[0x4f] = L"loadFlag";
      sVar4 = PAL_wcslen(L"loadFlag");
      psVar3[0x4f] = sVar4;
      ppcVar2[0x50] = L"isEval";
      sVar4 = PAL_wcslen(L"isEval");
      psVar3[0x50] = sVar4;
      ppcVar2[0x51] = L"isDynamic";
      sVar4 = PAL_wcslen(L"isDynamic");
      psVar3[0x51] = sVar4;
      ppcVar2[0x52] = L"isRuntime";
      sVar4 = PAL_wcslen(L"isRuntime");
      psVar3[0x52] = sVar4;
      ppcVar2[0x53] = L"isBound";
      sVar4 = PAL_wcslen(L"isBound");
      psVar3[0x53] = sVar4;
      ppcVar2[0x54] = L"isNumeric";
      sVar4 = PAL_wcslen(L"isNumeric");
      psVar3[0x54] = sVar4;
      ppcVar2[0x55] = L"isSymbol";
      sVar4 = PAL_wcslen(L"isSymbol");
      psVar3[0x55] = sVar4;
      ppcVar2[0x56] = L"isValid";
      sVar4 = PAL_wcslen(L"isValid");
      psVar3[0x56] = sVar4;
      ppcVar2[0x57] = L"arch";
      sVar4 = PAL_wcslen(L"arch");
      psVar3[0x57] = sVar4;
      ppcVar2[0x58] = L"platform";
      sVar4 = PAL_wcslen(L"platform");
      psVar3[0x58] = sVar4;
      ppcVar2[0x59] = L"diagEnabled";
      sVar4 = PAL_wcslen(L"diagEnabled");
      psVar3[0x59] = sVar4;
      ppcVar2[0x5a] = L"timeTotal";
      sVar4 = PAL_wcslen(L"timeTotal");
      psVar3[0x5a] = sVar4;
      ppcVar2[0x5b] = L"timeGC";
      sVar4 = PAL_wcslen(L"timeGC");
      psVar3[0x5b] = sVar4;
      ppcVar2[0x5c] = L"timeMark";
      sVar4 = PAL_wcslen(L"timeMark");
      psVar3[0x5c] = sVar4;
      ppcVar2[0x5d] = L"timeExtract";
      sVar4 = PAL_wcslen(L"timeExtract");
      psVar3[0x5d] = sVar4;
      ppcVar2[0x5e] = L"timeWrite";
      sVar4 = PAL_wcslen(L"timeWrite");
      psVar3[0x5e] = sVar4;
      ppcVar2[0x5f] = L"usedMemory";
      sVar4 = PAL_wcslen(L"usedMemory");
      psVar3[0x5f] = sVar4;
      ppcVar2[0x60] = L"reservedMemory";
      sVar4 = PAL_wcslen(L"reservedMemory");
      psVar3[0x60] = sVar4;
      ppcVar2[0x61] = L"eventKind";
      sVar4 = PAL_wcslen(L"eventKind");
      psVar3[0x61] = sVar4;
      ppcVar2[0x62] = L"eventResultStatus";
      sVar4 = PAL_wcslen(L"eventResultStatus");
      psVar3[0x62] = sVar4;
      ppcVar2[99] = L"eventTime";
      sVar4 = PAL_wcslen(L"eventTime");
      psVar3[99] = sVar4;
      ppcVar2[100] = L"functionTime";
      sVar4 = PAL_wcslen(L"functionTime");
      psVar3[100] = sVar4;
      ppcVar2[0x65] = L"loopTime";
      sVar4 = PAL_wcslen(L"loopTime");
      psVar3[0x65] = sVar4;
      ppcVar2[0x66] = L"jsrtEventKind";
      sVar4 = PAL_wcslen(L"jsrtEventKind");
      psVar3[0x66] = sVar4;
      ppcVar2[0x67] = L"matchingCallBegin";
      sVar4 = PAL_wcslen(L"matchingCallBegin");
      psVar3[0x67] = sVar4;
      ppcVar2[0x68] = L"rootNestingDepth";
      sVar4 = PAL_wcslen(L"rootNestingDepth");
      psVar3[0x68] = sVar4;
      ppcVar2[0x69] = L"hostCallbackId";
      sVar4 = PAL_wcslen(L"hostCallbackId");
      psVar3[0x69] = sVar4;
      ppcVar2[0x6a] = L"newCallbackId";
      sVar4 = PAL_wcslen(L"newCallbackId");
      psVar3[0x6a] = sVar4;
      ppcVar2[0x6b] = L"beginTime";
      sVar4 = PAL_wcslen(L"beginTime");
      psVar3[0x6b] = sVar4;
      ppcVar2[0x6c] = L"endTime";
      sVar4 = PAL_wcslen(L"endTime");
      psVar3[0x6c] = sVar4;
      ppcVar2[0x6d] = L"snapshotDir";
      sVar4 = PAL_wcslen(L"snapshotDir");
      psVar3[0x6d] = sVar4;
      ppcVar2[0x6e] = L"restoreTime";
      sVar4 = PAL_wcslen(L"restoreTime");
      psVar3[0x6e] = sVar4;
      ppcVar2[0x6f] = L"restoreLogTag";
      sVar4 = PAL_wcslen(L"restoreLogTag");
      psVar3[0x6f] = sVar4;
      ppcVar2[0x70] = L"restoreIdentityTag";
      sVar4 = PAL_wcslen(L"restoreIdentityTag");
      psVar3[0x70] = sVar4;
      ppcVar2[0x71] = L"logDir";
      sVar4 = PAL_wcslen(L"logDir");
      psVar3[0x71] = sVar4;
      ppcVar2[0x72] = L"frame_slotArray";
      sVar4 = PAL_wcslen(L"frame_slotArray");
      psVar3[0x72] = sVar4;
      ppcVar2[0x73] = L"arguments_values";
      sVar4 = PAL_wcslen(L"arguments_values");
      psVar3[0x73] = sVar4;
      ppcVar2[0x74] = L"target";
      sVar4 = PAL_wcslen(L"target");
      psVar3[0x74] = sVar4;
      ppcVar2[0x75] = L"reject";
      sVar4 = PAL_wcslen(L"reject");
      psVar3[0x75] = sVar4;
      ppcVar2[0x76] = L"resolve";
      sVar4 = PAL_wcslen(L"resolve");
      psVar3[0x76] = sVar4;
      ppcVar2[0x77] = L"argument";
      sVar4 = PAL_wcslen(L"argument");
      psVar3[0x77] = sVar4;
      *names = ppcVar2;
      *lengths = psVar3;
      return;
    }
  }
  TTDAbort_unrecoverable_error("OOM in TTD");
}

Assistant:

void InitKeyNamesArray(const char16*** names, size_t** lengths)
        {
            const char16** nameArray = TT_HEAP_ALLOC_ARRAY(const char16*, (uint32)Key::Count);
            size_t* lengthArray = TT_HEAP_ALLOC_ARRAY(size_t, (uint32)Key::Count);

#define ENTRY_SERIALIZE_ENUM(K) { nameArray[(uint32)Key::##K] = _u(#K); lengthArray[(uint32)Key::##K] = wcslen(_u(#K)); }
#include "TTSerializeEnum.h"

            *names = nameArray;
            *lengths = lengthArray;
        }